

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

ASN1_STRING * gost_encode_cms_params(int ka_nid)

{
  int iVar1;
  ASN1_STRING *a;
  GOST_KEY_PARAMS *a_00;
  ASN1_OBJECT *pAVar2;
  
  a = ASN1_STRING_new();
  a_00 = GOST_KEY_PARAMS_new();
  iVar1 = 0x185;
  if (a_00 != (GOST_KEY_PARAMS *)0x0 && a != (ASN1_STRING *)0x0) {
    pAVar2 = OBJ_nid2obj(ka_nid);
    a_00->key_params = (ASN1_OBJECT *)pAVar2;
    iVar1 = i2d_GOST_KEY_PARAMS(a_00,&a->data);
    a->length = iVar1;
    if (-1 < iVar1) {
      a->type = 0x10;
      GOST_KEY_PARAMS_free(a_00);
      return (ASN1_STRING *)a;
    }
    iVar1 = 0x18d;
  }
  ERR_GOST_error(0xa1,0xc0100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                 ,iVar1);
  GOST_KEY_PARAMS_free(a_00);
  ASN1_STRING_free(a);
  return (ASN1_STRING *)0x0;
}

Assistant:

static ASN1_STRING *gost_encode_cms_params(int ka_nid)
{
	ASN1_STRING *ret = NULL;
	ASN1_STRING *params = ASN1_STRING_new();

	/* It's a hack. We have only one OID here, so we can use
	 * GOST_KEY_PARAMS which is a sequence of 3 OIDs,
	 * the 1st one is mandatory and the rest are optional */
	GOST_KEY_PARAMS *gkp = GOST_KEY_PARAMS_new();

	if (params == NULL || gkp == NULL) {
		  GOSTerr(GOST_F_GOST_ENCODE_CMS_PARAMS, ERR_R_MALLOC_FAILURE);
			goto end;
	}

	gkp->key_params = OBJ_nid2obj(ka_nid);
	params->length = i2d_GOST_KEY_PARAMS(gkp, &params->data);

	if (params->length < 0) {
		  GOSTerr(GOST_F_GOST_ENCODE_CMS_PARAMS, ERR_R_MALLOC_FAILURE);
			goto end;
	}

	params->type = V_ASN1_SEQUENCE;
	ret = params;

end:
	GOST_KEY_PARAMS_free(gkp);

	if (ret == NULL)
		ASN1_STRING_free(params);

	return ret;
}